

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Iterator::Equals(Iterator *this,
                  ParamIteratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  Iterator *pIVar5;
  GTestLog local_1c;
  ParamIteratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  ParamIteratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *other_local;
  Iterator *this_local;
  
  local_18 = other;
  other_local = &this->
                 super_ParamIteratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  iVar2 = (*(this->
            super_ParamIteratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )._vptr_ParamIteratorInterface[2])();
  iVar3 = (*local_18->_vptr_ParamIteratorInterface[2])();
  bVar1 = IsTrue(CONCAT44(extraout_var,iVar2) == CONCAT44(extraout_var_00,iVar3));
  if (!bVar1) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                       ,0x15a);
    poVar4 = GTestLog::GetStream(&local_1c);
    poVar4 = std::operator<<(poVar4,"Condition BaseGenerator() == other.BaseGenerator() failed. ");
    poVar4 = std::operator<<(poVar4,"The program attempted to compare iterators ");
    poVar4 = std::operator<<(poVar4,"from different generators.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    GTestLog::~GTestLog(&local_1c);
  }
  pIVar5 = CheckedDowncastToActualType<testing::internal::ValuesInIteratorRangeGenerator<std::__cxx11::string>::Iterator_const,testing::internal::ParamIteratorInterface<std::__cxx11::string>const>
                     (local_18);
  bVar1 = __gnu_cxx::operator==(&this->iterator_,&pIVar5->iterator_);
  return bVar1;
}

Assistant:

bool Equals(const ParamIteratorInterface<T>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      return iterator_ ==
             CheckedDowncastToActualType<const Iterator>(&other)->iterator_;
    }